

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O0

void __thiscall BayesianGameBase::SetProbability(BayesianGameBase *this,Index i,double p)

{
  reference pvVar1;
  uint in_ESI;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *in_RDI;
  value_type in_XMM0_Qa;
  double *in_stack_ffffffffffffffa8;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  *this_00;
  sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
  local_30 [2];
  
  if (((byte)in_RDI[8] & 1) == 0) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(ulong)in_ESI);
    *pvVar1 = in_XMM0_Qa;
  }
  else {
    this_00 = local_30;
    boost::numeric::ublas::
    mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
    ::operator[](in_RDI,(size_type)this_00);
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,boost::numeric::ublas::map_std<unsigned_long,double,std::allocator<std::pair<unsigned_long_const,double>>>>>
    ::operator=(this_00,in_stack_ffffffffffffffa8);
    boost::numeric::ublas::
    sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
    ::~sparse_vector_element
              ((sparse_vector_element<boost::numeric::ublas::mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                *)0x12672c);
  }
  return;
}

Assistant:

void SetProbability(Index i, double p)
        { if(_m_useSparse) _m_jTypeProbsSparse[i]=p;
            else _m_jTypeProbs[i]=p;}